

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void upb_Arena_ShrinkLast(upb_Arena *a,void *ptr,size_t oldsize,size_t size)

{
  uint __line;
  _Bool _Var1;
  ulong uVar2;
  ulong oldsize_00;
  char *__assertion;
  
  if (ptr == (void *)0x0) {
    __assertion = "ptr";
    __line = 0x47;
  }
  else {
    if (size <= oldsize) {
      uVar2 = size + 7 & 0xfffffffffffffff8;
      oldsize_00 = oldsize + 7 & 0xfffffffffffffff8;
      if (uVar2 != oldsize_00) {
        if ((char *)((long)ptr + oldsize_00) == a->ptr_dont_copy_me__upb_internal_use_only) {
          a->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)ptr + uVar2);
        }
        else {
          _Var1 = _upb_Arena_WasLastAlloc(a,ptr,oldsize_00);
          if (!_Var1) {
            __assertion = "_upb_Arena_WasLastAlloc(a, ptr, oldsize)";
            __line = 0x58;
            goto LAB_0014a5d2;
          }
        }
      }
      return;
    }
    __assertion = "size <= oldsize";
    __line = 0x48;
  }
LAB_0014a5d2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                ,__line,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
}

Assistant:

UPB_API_INLINE void upb_Arena_ShrinkLast(struct upb_Arena* a, void* ptr,
                                         size_t oldsize, size_t size) {
  UPB_TSAN_CHECK_WRITE(a->UPB_ONLYBITS(ptr));
  UPB_ASSERT(ptr);
  UPB_ASSERT(size <= oldsize);
  size = UPB_ALIGN_MALLOC(size) + UPB_ASAN_GUARD_SIZE;
  oldsize = UPB_ALIGN_MALLOC(oldsize) + UPB_ASAN_GUARD_SIZE;
  if (size == oldsize) {
    return;
  }
  char* arena_ptr = a->UPB_ONLYBITS(ptr);
  // If it's the last alloc in the last block, we can resize.
  if ((char*)ptr + oldsize == arena_ptr) {
    a->UPB_ONLYBITS(ptr) = (char*)ptr + size;
  } else {
    // If not, verify that it could have been a full-block alloc that did not
    // replace the last block.
#ifndef NDEBUG
    bool _upb_Arena_WasLastAlloc(struct upb_Arena * a, void* ptr,
                                 size_t oldsize);
    UPB_ASSERT(_upb_Arena_WasLastAlloc(a, ptr, oldsize));
#endif
  }
  UPB_POISON_MEMORY_REGION((char*)ptr + (size - UPB_ASAN_GUARD_SIZE),
                           oldsize - size);
}